

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O2

void ryg_dxt::sInitDXT(void)

{
  uint uVar1;
  char cVar2;
  sInt i_2;
  sInt i;
  long lVar3;
  sInt i_1;
  int iVar4;
  
  uVar1 = 0;
  cVar2 = '\0';
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
    (&Expand5)[lVar3] = (char)(uVar1 >> 2) + cVar2;
    cVar2 = cVar2 + '\b';
    uVar1 = uVar1 + 1;
  }
  uVar1 = 0;
  cVar2 = '\0';
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
    (&Expand6)[lVar3] = (char)(uVar1 >> 4) + cVar2;
    cVar2 = cVar2 + '\x04';
    uVar1 = uVar1 + 1;
  }
  for (lVar3 = 0; lVar3 != 0x110; lVar3 = lVar3 + 1) {
    iVar4 = 8;
    if (8 < (int)lVar3) {
      iVar4 = (int)lVar3;
    }
    if (0x106 < iVar4) {
      iVar4 = 0x107;
    }
    (&QuantRBTab)[lVar3] = (&Expand5)[(iVar4 * 0x1f + (iVar4 * 0x1f - 0x78U >> 8)) - 0x78 >> 8];
    (&QuantGTab)[lVar3] = (&Expand6)[(iVar4 * 0x3f + (iVar4 * 0x3f - 0x178U >> 8)) - 0x178 >> 8];
  }
  PrepareOptTable4(OMatch5,&Expand5,0x20);
  PrepareOptTable4(OMatch6,&Expand6,0x40);
  PrepareOptTable3(OMatch5_3,&Expand5,0x20);
  PrepareOptTable3(OMatch6_3,&Expand6,0x40);
  return;
}

Assistant:

void sInitDXT() {
  for (sInt i = 0; i < 32; i++)
    Expand5[i] = (i << 3) | (i >> 2);

  for (sInt i = 0; i < 64; i++)
    Expand6[i] = (i << 2) | (i >> 4);

  for (sInt i = 0; i < 256 + 16; i++) {
    sInt v = sClamp(i - 8, 0, 255);
    QuantRBTab[i] = Expand5[Mul8Bit(v, 31)];
    QuantGTab[i] = Expand6[Mul8Bit(v, 63)];
  }

  PrepareOptTable4(&OMatch5[0][0], Expand5, 32);
  PrepareOptTable4(&OMatch6[0][0], Expand6, 64);

  PrepareOptTable3(&OMatch5_3[0][0], Expand5, 32);
  PrepareOptTable3(&OMatch6_3[0][0], Expand6, 64);
}